

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::PrimitiveInstanceSymbol::visitExprs<slang::ast::CheckerMemberVisitor&>
          (PrimitiveInstanceSymbol *this,CheckerMemberVisitor *visitor)

{
  bool bVar1;
  reference ppEVar2;
  Expression *conn;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  PrimitiveInstanceSymbol *in_stack_00000440;
  CheckerMemberVisitor *in_stack_ffffffffffffffb8;
  Expression *in_stack_ffffffffffffffc0;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_28;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *local_18;
  
  local_28 = getPortConnections(in_stack_00000440);
  local_18 = &local_28;
  local_30._M_current =
       (Expression **)
       std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffffb8);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
            (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
              ::operator*(&local_30);
    in_stack_ffffffffffffffc0 = *ppEVar2;
    Expression::visit<slang::ast::CheckerMemberVisitor&>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void PrimitiveInstanceSymbol::visitExprs(TVisitor&& visitor) const {
    for (auto conn : getPortConnections())
        conn->visit(visitor);
}